

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnumeric.cpp
# Opt level: O1

quint64 qFloatDistance(double a,double b)

{
  quint64 qVar1;
  long lVar2;
  double dVar3;
  double b_00;
  double dVar4;
  
  lVar2 = 0;
  while( true ) {
    if ((a == b) && (dVar3 = 0.0, !NAN(a) && !NAN(b))) goto LAB_00216d09;
    dVar4 = -b;
    dVar3 = -a;
    b_00 = dVar3;
    if (dVar3 <= a) {
      b_00 = a;
    }
    if (a < dVar3 != dVar4 <= b) break;
    b = (double)((ulong)b & -(ulong)(a < 0.0) | ~-(ulong)(a < 0.0) & (ulong)dVar4);
    qVar1 = qFloatDistance(0.0,b_00);
    lVar2 = lVar2 + qVar1;
    a = 0.0;
  }
  dVar4 = (double)(~-(ulong)(a < 0.0) & (ulong)b | (ulong)dVar4 & -(ulong)(a < 0.0));
  if (((a != 0.0) || (dVar3 = dVar4, NAN(a))) && ((b != 0.0 || (dVar3 = b_00, NAN(b))))) {
    dVar3 = b_00;
    if (dVar4 < b_00) {
      dVar3 = dVar4;
      dVar4 = b_00;
    }
    dVar3 = (double)((long)dVar4 - (long)dVar3);
  }
LAB_00216d09:
  return lVar2 + (long)dVar3;
}

Assistant:

Q_CORE_EXPORT quint64 qFloatDistance(double a, double b)
{
    static const quint64 smallestPositiveFloatAsBits = 0x1;  // denormalized, (SMALLEST)
    /* Assumes:
       * IEE754 format double precision
       * Integers and floats have the same endian
    */
    static_assert(sizeof(quint64) == sizeof(double));
    Q_ASSERT(qIsFinite(a) && qIsFinite(b));
    if (a == b)
        return 0;
    if ((a < 0) != (b < 0)) {
        // if they have different signs
        if (a < 0)
            a = -a;
        else /*if (b < 0)*/
            b = -b;
        return qFloatDistance(0.0, a) + qFloatDistance(0.0, b);
    }
    if (a < 0) {
        a = -a;
        b = -b;
    }
    // at this point a and b should not be negative

    // 0 is special
    if (!a)
        return d2i(b) - smallestPositiveFloatAsBits + 1;
    if (!b)
        return d2i(a) - smallestPositiveFloatAsBits + 1;

    // finally do the common integer subtraction
    return a > b ? d2i(a) - d2i(b) : d2i(b) - d2i(a);
}